

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void __thiscall TCMallocTest_ManyThreads_Test::TestBody(TCMallocTest_ManyThreads_Test *this)

{
  pointer ptVar1;
  tuple<TesterThread_*,_std::default_delete<TesterThread>_> this_00;
  ulong uVar2;
  _Head_base<0UL,_TesterThread_*,_false> _Var3;
  pointer ptVar4;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX_00;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX_01;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX_02;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX_03;
  anon_class_8_1_ba1d7bde_for__M_head_impl *__args;
  int id;
  thread *t;
  ulong uVar5;
  _Head_base<0UL,_TesterThread_*,_false> _Var6;
  long lVar7;
  undefined1 auStack_78 [8];
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ptrs;
  _Head_base<0UL,_TesterThread_*,_false> local_58;
  size_type_conflict local_50;
  undefined1 auStack_48 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  id = 0;
  printf("Testing threaded allocation/deallocation (%d threads)\n",10);
  auStack_78 = (undefined1  [8])0x0;
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::reserve((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)auStack_78,10);
  do {
    this_00.super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
    super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>)operator_new(0xa8);
    TesterThread::TesterThread
              ((TesterThread *)
               this_00.super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
               super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl,
               (vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                *)auStack_78,id);
    auStack_48 = (undefined1  [8])
                 this_00.super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
                 super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
    ::emplace_back<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>
              ((vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
                *)auStack_78,
               (unique_ptr<TesterThread,_std::default_delete<TesterThread>_> *)auStack_48);
    if ((_Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>)auStack_48 !=
        (TesterThread *)0x0) {
      (**(code **)(*(long *)auStack_48 + 8))();
    }
    id = id + 1;
  } while (id != 10);
  auStack_48 = (undefined1  [8])0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48,10);
  lVar7 = 0;
  __args = extraout_RDX;
  do {
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58._M_head_impl =
         (((pointer)((long)auStack_78 + lVar7 * 8))->_M_t).
         super___uniq_ptr_impl<TesterThread,_std::default_delete<TesterThread>_>._M_t.
         super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
         super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ptrs.
      super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_48;
      if ((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start - (long)auStack_48 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar5 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)auStack_48 >> 3;
      uVar2 = uVar5 + (uVar5 == 0);
      local_50 = uVar2 + uVar5;
      if (0xffffffffffffffe < local_50) {
        local_50 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar2,uVar5)) {
        local_50 = 0xfffffffffffffff;
      }
      if (local_50 == 0) {
        _Var3._M_head_impl = (TesterThread *)0x0;
      }
      else {
        _Var3._M_head_impl =
             (TesterThread *)
             __gnu_cxx::new_allocator<std::thread>::allocate
                       ((new_allocator<std::thread> *)auStack_48,local_50,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,TCMallocTest_ManyThreads_Test::TestBody()::__0>
                ((allocator_type *)((id *)&(_Var3._M_head_impl)->_vptr_TesterThread + uVar5),
                 (thread *)&local_58,__args);
      _Var6._M_head_impl = _Var3._M_head_impl;
      for (ptVar4 = (pointer)ptrs.
                             super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage; ptVar4 != ptVar1;
          ptVar4 = ptVar4 + 1) {
        ((id *)&(_Var6._M_head_impl)->_vptr_TesterThread)->_M_thread = 0;
        ((id *)&(_Var6._M_head_impl)->_vptr_TesterThread)->_M_thread =
             (native_handle_type)
             (((__uniq_ptr_impl<TesterThread,_std::default_delete<TesterThread>_> *)
              &(ptVar4->_M_id)._M_thread)->_M_t).
             super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
             super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl;
        (((__uniq_ptr_impl<TesterThread,_std::default_delete<TesterThread>_> *)
         &(ptVar4->_M_id)._M_thread)->_M_t).
        super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
        super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl = (TesterThread *)0x0;
        _Var6._M_head_impl = (TesterThread *)&(_Var6._M_head_impl)->all_threads_;
      }
      __args = extraout_RDX_02;
      if (ptrs.
          super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(ptrs.
                        super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)ptrs.
                              super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __args = extraout_RDX_03;
      }
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((id *)&(_Var3._M_head_impl)->_vptr_TesterThread + local_50);
      auStack_48 = (undefined1  [8])_Var3._M_head_impl;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,TCMallocTest_ManyThreads_Test::TestBody()::__0>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start,(thread *)&local_58,__args);
      __args = extraout_RDX_00;
      _Var6._M_head_impl =
           (TesterThread *)
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&(_Var6._M_head_impl)->all_threads_;
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = lVar7 + 1;
    _Var3._M_head_impl = (TesterThread *)auStack_48;
  } while (lVar7 != 10);
  for (; _Var3._M_head_impl != (TesterThread *)ptVar1;
      _Var3._M_head_impl = (TesterThread *)&(_Var3._M_head_impl)->all_threads_) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48);
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::~vector((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)auStack_78);
  return;
}

Assistant:

TEST(TCMallocTest, ManyThreads) {
  printf("Testing threaded allocation/deallocation (%d threads)\n",
          FLAGS_numthreads);

  std::vector<std::unique_ptr<TesterThread>> ptrs;
  ptrs.reserve(FLAGS_numthreads);
  // Note, the logic inside PassObject requires us to create all
  // TesterThreads first, before starting any of them.
  for (int i = 0; i < FLAGS_numthreads; i++) {
    ptrs.emplace_back(std::make_unique<TesterThread>(ptrs, i));
  }

  std::vector<std::thread> threads;
  threads.reserve(FLAGS_numthreads);
  for (int i = 0; i < FLAGS_numthreads; i++) {
    threads.emplace_back([thr = ptrs[i].get()] () {
      thr->Run();
    });
  }
  for (auto& t : threads) {
    t.join();
  }
}